

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O1

void pbrt::ParallelInit(int nThreads)

{
  int iVar1;
  ThreadPool *this;
  pointer __p;
  __uniq_ptr_impl<pbrt::ThreadPool,_std::default_delete<pbrt::ThreadPool>_> local_18;
  
  if (maxThreadIndexCalled == '\x01') {
    LogFatal<char_const(&)[22]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.cpp"
               ,0x172,"Check failed: %s",(char (*) [22])"!maxThreadIndexCalled");
  }
  if (threadPool == 0) {
    if (nThreads < 1) {
      iVar1 = std::thread::hardware_concurrency();
      nThreads = 1;
      if (1 < iVar1) {
        nThreads = iVar1;
      }
    }
    this = (ThreadPool *)operator_new(0x80);
    ThreadPool::ThreadPool(this,nThreads);
    local_18._M_t.super__Tuple_impl<0UL,_pbrt::ThreadPool_*,_std::default_delete<pbrt::ThreadPool>_>
    .super__Head_base<0UL,_pbrt::ThreadPool_*,_false>._M_head_impl =
         (tuple<pbrt::ThreadPool_*,_std::default_delete<pbrt::ThreadPool>_>)
         (_Tuple_impl<0UL,_pbrt::ThreadPool_*,_std::default_delete<pbrt::ThreadPool>_>)0x0;
    std::__uniq_ptr_impl<pbrt::ThreadPool,_std::default_delete<pbrt::ThreadPool>_>::reset
              ((__uniq_ptr_impl<pbrt::ThreadPool,_std::default_delete<pbrt::ThreadPool>_> *)
               &threadPool,this);
    std::unique_ptr<pbrt::ThreadPool,_std::default_delete<pbrt::ThreadPool>_>::~unique_ptr
              ((unique_ptr<pbrt::ThreadPool,_std::default_delete<pbrt::ThreadPool>_> *)&local_18);
    return;
  }
  LogFatal<char_const(&)[12]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.cpp"
             ,0x174,"Check failed: %s",(char (*) [12])"!threadPool");
}

Assistant:

void ParallelInit(int nThreads) {
    // This is risky: if the caller has allocated per-thread data
    // structures before calling ParallelInit(), then we may end up having
    // them accessed with a higher ThreadIndex than the caller expects.
    CHECK(!maxThreadIndexCalled);

    CHECK(!threadPool);
    if (nThreads <= 0)
        nThreads = AvailableCores();
    threadPool = std::make_unique<ThreadPool>(nThreads);
}